

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

void __thiscall slang::parsing::Preprocessor::pushSource(Preprocessor *this,SourceBuffer buffer)

{
  unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *args;
  long in_RDI;
  LexerOptions *in_stack_00000078;
  SourceManager *in_stack_00000080;
  Diagnostics *in_stack_00000088;
  BumpAllocator *in_stack_00000090;
  SourceBuffer *in_stack_00000098;
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  *this_00;
  unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *this_01;
  
  this_01 = (unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
            &stack0x00000008;
  args = (unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
         (in_RDI + 0xf8);
  this_00 = (SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
             *)&stack0xfffffffffffffff0;
  std::
  make_unique<slang::parsing::Lexer,slang::SourceBuffer&,slang::BumpAllocator&,slang::Diagnostics&,slang::SourceManager&,slang::parsing::LexerOptions&>
            (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
             in_stack_00000078);
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
  ::emplace_back<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
            (this_00,args);
  std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>::~unique_ptr
            (this_01);
  return;
}

Assistant:

void Preprocessor::pushSource(SourceBuffer buffer) {
    SLANG_ASSERT(buffer.id);

    lexerStack.emplace_back(
        std::make_unique<Lexer>(buffer, alloc, diagnostics, sourceManager, lexerOptions));
}